

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

void __thiscall
EOPlus::Parser_Token_Server_Base::~Parser_Token_Server_Base(Parser_Token_Server_Base *this)

{
  this->_vptr_Parser_Token_Server_Base = (_func_int **)&PTR___cxa_pure_virtual_001bc710;
  std::__cxx11::string::~string((string *)&(this->reject_token).data.val_string);
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::~deque(&(this->token_buffer).c);
  return;
}

Assistant:

Parser_Token_Server_Base::~Parser_Token_Server_Base()
	{ }